

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  Scene *pSVar2;
  float *pfVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  size_t sVar18;
  bool bVar19;
  uint uVar20;
  undefined4 uVar21;
  int iVar22;
  float *vertices;
  long lVar23;
  size_t sVar24;
  ulong uVar25;
  NodeRef root;
  long lVar26;
  uint uVar27;
  NodeRef *pNVar28;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar29;
  long lVar30;
  ulong uVar31;
  vint4 ai_2;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  vint4 bi_3;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 bi_2;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 bi_1;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vint4 ai_1;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  float fVar80;
  float fVar81;
  vint4 ai_3;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  vint4 bi;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  uint uVar96;
  uint uVar99;
  uint uVar100;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar97;
  undefined1 auVar98 [16];
  uint uVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  Precalculations pre;
  undefined1 local_3888 [8];
  float fStack_3880;
  float fStack_387c;
  undefined1 local_3878 [16];
  undefined1 local_3858 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_3818 [8];
  float fStack_3810;
  float fStack_380c;
  undefined1 local_3808 [16];
  Geometry *local_37f8;
  RayK<4> *local_37f0;
  undefined1 local_37e8 [16];
  undefined1 local_37d8 [8];
  undefined8 uStack_37d0;
  vbool<4> terminated;
  undefined1 local_37a8 [16];
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_3738;
  undefined1 local_3708 [8];
  float fStack_3700;
  float fStack_36fc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_36f8;
  undefined1 local_36e8 [16];
  undefined1 local_36d8 [16];
  uint local_36c8;
  uint uStack_36c4;
  uint uStack_36c0;
  uint uStack_36bc;
  uint uStack_36b8;
  uint uStack_36b4;
  uint uStack_36b0;
  uint uStack_36ac;
  undefined1 local_36a8 [16];
  undefined8 local_3698;
  undefined8 uStack_3690;
  undefined8 local_3688;
  undefined8 uStack_3680;
  undefined1 local_3678 [16];
  undefined1 local_3668 [16];
  float local_3658;
  float fStack_3654;
  float fStack_3650;
  float fStack_364c;
  undefined1 local_3648 [16];
  float local_3638;
  float fStack_3634;
  float fStack_3630;
  float fStack_362c;
  float local_3628;
  float fStack_3624;
  float fStack_3620;
  float fStack_361c;
  Vec3vf<4> Ng;
  TravRayK<4,_false> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar39 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar58 = vpcmpeqd_avx(auVar39,(undefined1  [16])valid_i->field_0);
    auVar32 = ZEXT816(0) << 0x40;
    auVar38 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar32,5);
    auVar59 = auVar58 & auVar38;
    if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar59[0xf] < '\0')
    {
      local_3678 = vandps_avx(auVar38,auVar58);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      local_36a8._8_4_ = 0x7fffffff;
      local_36a8._0_8_ = 0x7fffffff7fffffff;
      local_36a8._12_4_ = 0x7fffffff;
      auVar38 = vandps_avx(local_36a8,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar92._8_4_ = 0x219392ef;
      auVar92._0_8_ = 0x219392ef219392ef;
      auVar92._12_4_ = 0x219392ef;
      auVar38 = vcmpps_avx(auVar38,auVar92,1);
      auVar58 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar92,auVar38);
      auVar38 = vandps_avx(local_36a8,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar38 = vcmpps_avx(auVar38,auVar92,1);
      auVar59 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar92,auVar38);
      auVar38 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,local_36a8);
      auVar38 = vcmpps_avx(auVar38,auVar92,1);
      auVar38 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar92,auVar38);
      auVar64 = vrcpps_avx(auVar58);
      auVar93._8_4_ = 0x3f800000;
      auVar93._0_8_ = 0x3f8000003f800000;
      auVar93._12_4_ = 0x3f800000;
      auVar58 = vfnmadd213ps_fma(auVar58,auVar64,auVar93);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar58,auVar64,auVar64)
      ;
      auVar58 = vrcpps_avx(auVar59);
      auVar59 = vfnmadd213ps_fma(auVar59,auVar58,auVar93);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar59,auVar58,auVar58)
      ;
      auVar58 = vrcpps_avx(auVar38);
      auVar38 = vfnmadd213ps_fma(auVar38,auVar58,auVar93);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar38,auVar58,auVar58)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * (float)tray.org.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * (float)tray.org.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * (float)tray.org.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * (float)tray.org.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar38 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar32,1);
      auVar58._8_4_ = 0x20;
      auVar58._0_8_ = 0x2000000020;
      auVar58._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar38,auVar58);
      auVar38 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar32,5);
      auVar59._8_4_ = 0x40;
      auVar59._0_8_ = 0x4000000040;
      auVar59._12_4_ = 0x40;
      auVar64._8_4_ = 0x60;
      auVar64._0_8_ = 0x6000000060;
      auVar64._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar64,auVar59,auVar38);
      auVar38 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar32,5);
      auVar65._8_4_ = 0x80;
      auVar65._0_8_ = 0x8000000080;
      auVar65._12_4_ = 0x80;
      auVar70._8_4_ = 0xa0;
      auVar70._0_8_ = 0xa0000000a0;
      auVar70._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar70,auVar65,auVar38);
      auVar38 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar32);
      auVar58 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar32);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar95 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar38,local_3678);
      auVar45 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar38._8_4_ = 0xff800000;
      auVar38._0_8_ = 0xff800000ff800000;
      auVar38._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar38,auVar58,local_3678);
      terminated.field_0.i[1] = local_3678._4_4_ ^ auVar39._4_4_;
      terminated.field_0.i[0] = local_3678._0_4_ ^ auVar39._0_4_;
      terminated.field_0.i[2] = local_3678._8_4_ ^ auVar39._8_4_;
      terminated.field_0.i[3] = local_3678._12_4_ ^ auVar39._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar27 = 3;
      }
      else {
        uVar27 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_37f0 = ray + 0x80;
      pNVar28 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar29 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      local_3688 = mm_lookupmask_ps._0_8_;
      uStack_3680 = mm_lookupmask_ps._8_8_;
      local_3698 = mm_lookupmask_ps._240_8_;
      uStack_3690 = mm_lookupmask_ps._248_8_;
LAB_0163c362:
      do {
        do {
          root.ptr = pNVar28[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0163d366;
          pNVar28 = pNVar28 + -1;
          paVar29 = paVar29 + -1;
          aVar97 = *paVar29;
          auVar38 = vcmpps_avx((undefined1  [16])aVar97,(undefined1  [16])tray.tfar.field_0,1);
          uVar20 = vmovmskps_avx(auVar38);
        } while (uVar20 == 0);
        uVar31 = (ulong)(byte)uVar20;
        if (uVar27 < (uint)POPCOUNT(uVar20 & 0xff)) {
LAB_0163c3a3:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0163d366;
              auVar38 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar97,6);
              if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar38 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar38 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar38[0xf]) goto LAB_0163c362;
              auVar38 = vpcmpeqd_avx(auVar38,auVar38);
              lVar26 = (root.ptr & 0xfffffffffffffff0) + 0x50;
              lVar23 = 0;
              local_37a8 = auVar38 ^ (undefined1  [16])terminated.field_0;
              goto LAB_0163c584;
            }
            sVar24 = 8;
            aVar97 = auVar95._0_16_;
            for (lVar23 = 0;
                (lVar23 != 8 &&
                (sVar1 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar23 * 8), sVar1 != 8));
                lVar23 = lVar23 + 1) {
              uVar21 = *(undefined4 *)(root.ptr + 0x40 + lVar23 * 4);
              auVar41._4_4_ = uVar21;
              auVar41._0_4_ = uVar21;
              auVar41._8_4_ = uVar21;
              auVar41._12_4_ = uVar21;
              auVar15._4_4_ = tray.org_rdir.field_0._4_4_;
              auVar15._0_4_ = tray.org_rdir.field_0._0_4_;
              auVar15._8_4_ = tray.org_rdir.field_0._8_4_;
              auVar15._12_4_ = tray.org_rdir.field_0._12_4_;
              auVar58 = vfmsub213ps_fma(auVar41,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar15);
              uVar21 = *(undefined4 *)(root.ptr + 0x80 + lVar23 * 4);
              auVar66._4_4_ = uVar21;
              auVar66._0_4_ = uVar21;
              auVar66._8_4_ = uVar21;
              auVar66._12_4_ = uVar21;
              auVar16._4_4_ = tray.org_rdir.field_0._20_4_;
              auVar16._0_4_ = tray.org_rdir.field_0._16_4_;
              auVar16._8_4_ = tray.org_rdir.field_0._24_4_;
              auVar16._12_4_ = tray.org_rdir.field_0._28_4_;
              auVar59 = vfmsub213ps_fma(auVar66,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar16);
              uVar21 = *(undefined4 *)(root.ptr + 0xc0 + lVar23 * 4);
              auVar76._4_4_ = uVar21;
              auVar76._0_4_ = uVar21;
              auVar76._8_4_ = uVar21;
              auVar76._12_4_ = uVar21;
              auVar17._4_4_ = tray.org_rdir.field_0._36_4_;
              auVar17._0_4_ = tray.org_rdir.field_0._32_4_;
              auVar17._8_4_ = tray.org_rdir.field_0._40_4_;
              auVar17._12_4_ = tray.org_rdir.field_0._44_4_;
              auVar32 = vfmsub213ps_fma(auVar76,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar17);
              uVar21 = *(undefined4 *)(root.ptr + 0x60 + lVar23 * 4);
              auVar88._4_4_ = uVar21;
              auVar88._0_4_ = uVar21;
              auVar88._8_4_ = uVar21;
              auVar88._12_4_ = uVar21;
              auVar64 = vfmsub213ps_fma(auVar88,(undefined1  [16])
                                                tray.rdir.field_0.field_0.x.field_0,auVar15);
              uVar21 = *(undefined4 *)(root.ptr + 0xa0 + lVar23 * 4);
              auVar60._4_4_ = uVar21;
              auVar60._0_4_ = uVar21;
              auVar60._8_4_ = uVar21;
              auVar60._12_4_ = uVar21;
              auVar65 = vfmsub213ps_fma(auVar60,(undefined1  [16])
                                                tray.rdir.field_0.field_0.y.field_0,auVar16);
              uVar21 = *(undefined4 *)(root.ptr + 0xe0 + lVar23 * 4);
              auVar46._4_4_ = uVar21;
              auVar46._0_4_ = uVar21;
              auVar46._8_4_ = uVar21;
              auVar46._12_4_ = uVar21;
              auVar70 = vfmsub213ps_fma(auVar46,(undefined1  [16])
                                                tray.rdir.field_0.field_0.z.field_0,auVar17);
              auVar38 = vpminsd_avx(auVar58,auVar64);
              auVar39 = vpminsd_avx(auVar59,auVar65);
              auVar38 = vpmaxsd_avx(auVar38,auVar39);
              auVar39 = vpminsd_avx(auVar32,auVar70);
              auVar39 = vpmaxsd_avx(auVar38,auVar39);
              auVar38 = vpmaxsd_avx(auVar58,auVar64);
              auVar58 = vpmaxsd_avx(auVar59,auVar65);
              auVar58 = vpminsd_avx(auVar38,auVar58);
              auVar38 = vpmaxsd_avx(auVar32,auVar70);
              auVar58 = vpminsd_avx(auVar58,auVar38);
              auVar38 = vpmaxsd_avx(auVar39,(undefined1  [16])tray.tnear.field_0);
              auVar58 = vpminsd_avx(auVar58,(undefined1  [16])tray.tfar.field_0);
              auVar38 = vcmpps_avx(auVar38,auVar58,2);
              auVar45 = ZEXT1664(auVar38);
              sVar18 = sVar24;
              aVar6 = aVar97;
              if (((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar38[0xf] < '\0') &&
                 (aVar6.v = (__m128)vblendvps_avx(auVar95._0_16_,auVar39,auVar38), sVar18 = sVar1,
                 sVar24 != 8)) {
                pNVar28->ptr = sVar24;
                pNVar28 = pNVar28 + 1;
                *paVar29 = aVar97;
                paVar29 = paVar29 + 1;
              }
              aVar97 = aVar6;
              sVar24 = sVar18;
            }
            if (sVar24 == 8) goto LAB_0163c526;
            auVar38 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar97,6);
            uVar21 = vmovmskps_avx(auVar38);
            root.ptr = sVar24;
          } while ((byte)uVar27 < (byte)POPCOUNT(uVar21));
          pNVar28->ptr = sVar24;
          pNVar28 = pNVar28 + 1;
          *paVar29 = aVar97;
          paVar29 = paVar29 + 1;
LAB_0163c526:
          iVar22 = 4;
        }
        else {
          while (uVar31 != 0) {
            sVar24 = 0;
            for (uVar25 = uVar31; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
              sVar24 = sVar24 + 1;
            }
            uVar31 = uVar31 - 1 & uVar31;
            auVar45 = ZEXT1664(auVar45._0_16_);
            bVar19 = occluded1(This,bvh,root,sVar24,&pre,ray,&tray,context);
            if (bVar19) {
              terminated.field_0.i[sVar24] = -1;
            }
          }
          auVar38 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar22 = 3;
          auVar95 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar38[0xf] < '\0') {
            auVar45 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar39._8_4_ = 0xff800000;
            auVar39._0_8_ = 0xff800000ff800000;
            auVar39._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar39,
                               (undefined1  [16])terminated.field_0);
            iVar22 = 2;
          }
          if (uVar27 < (uint)POPCOUNT(uVar20 & 0xff)) goto LAB_0163c3a3;
        }
      } while (iVar22 != 3);
LAB_0163d366:
      auVar38 = vandps_avx(local_3678,(undefined1  [16])terminated.field_0);
      auVar44._8_4_ = 0xff800000;
      auVar44._0_8_ = 0xff800000ff800000;
      auVar44._12_4_ = 0xff800000;
      auVar38 = vmaskmovps_avx(auVar38,auVar44);
      *(undefined1 (*) [16])local_37f0 = auVar38;
    }
  }
  return;
LAB_0163c584:
  do {
    auVar38 = auVar45._0_16_;
    if (lVar23 == (ulong)((uint)root.ptr & 0xf) - 8) break;
    pSVar2 = context->scene;
    lVar30 = -0x10;
    local_3878 = local_37a8;
    do {
      if ((lVar30 == 0) || (iVar22 = *(int *)(lVar26 + 0x10 + lVar30), iVar22 == -1)) break;
      uVar20 = *(uint *)(lVar26 + lVar30);
      pfVar3 = (pSVar2->vertices).items[uVar20];
      uVar31 = (ulong)*(uint *)(lVar26 + -0x40 + lVar30);
      uVar25 = (ulong)*(uint *)(lVar26 + -0x30 + lVar30);
      fVar75 = pfVar3[uVar31];
      auVar71._4_4_ = fVar75;
      auVar71._0_4_ = fVar75;
      auVar71._8_4_ = fVar75;
      auVar71._12_4_ = fVar75;
      fVar80 = pfVar3[uVar31 + 1];
      auVar77._4_4_ = fVar80;
      auVar77._0_4_ = fVar80;
      auVar77._8_4_ = fVar80;
      auVar77._12_4_ = fVar80;
      fVar81 = pfVar3[uVar31 + 2];
      auVar83._4_4_ = fVar81;
      auVar83._0_4_ = fVar81;
      auVar83._8_4_ = fVar81;
      auVar83._12_4_ = fVar81;
      local_3888._4_4_ = pfVar3[uVar25];
      local_3818._4_4_ = pfVar3[uVar25 + 1];
      local_37d8._4_4_ = pfVar3[uVar25 + 2];
      uVar31 = (ulong)*(uint *)(lVar26 + -0x10 + lVar30);
      fVar82 = pfVar3[uVar31];
      local_3628 = pfVar3[uVar31 + 1];
      local_3638 = pfVar3[uVar31 + 2];
      local_3888._0_4_ = local_3888._4_4_;
      fStack_3880 = (float)local_3888._4_4_;
      fStack_387c = (float)local_3888._4_4_;
      fVar105 = fVar75 - (float)local_3888._4_4_;
      auVar61._4_4_ = fVar105;
      auVar61._0_4_ = fVar105;
      auVar61._8_4_ = fVar105;
      auVar61._12_4_ = fVar105;
      local_3818._0_4_ = local_3818._4_4_;
      fStack_3810 = (float)local_3818._4_4_;
      fStack_380c = (float)local_3818._4_4_;
      fVar7 = fVar80 - (float)local_3818._4_4_;
      local_37d8._0_4_ = local_37d8._4_4_;
      uStack_37d0._0_4_ = local_37d8._4_4_;
      uStack_37d0._4_4_ = local_37d8._4_4_;
      fVar8 = fVar81 - (float)local_37d8._4_4_;
      auVar106._4_4_ = fVar8;
      auVar106._0_4_ = fVar8;
      auVar106._8_4_ = fVar8;
      auVar106._12_4_ = fVar8;
      fVar75 = fVar82 - fVar75;
      auVar67._4_4_ = fVar75;
      auVar67._0_4_ = fVar75;
      auVar67._8_4_ = fVar75;
      auVar67._12_4_ = fVar75;
      fVar75 = fVar75 * fVar8;
      fVar80 = local_3628 - fVar80;
      fVar105 = fVar80 * fVar105;
      auVar98._4_4_ = fVar80;
      auVar98._0_4_ = fVar80;
      auVar98._8_4_ = fVar80;
      auVar98._12_4_ = fVar80;
      auVar89._4_4_ = fVar7;
      auVar89._0_4_ = fVar7;
      auVar89._8_4_ = fVar7;
      auVar89._12_4_ = fVar7;
      fVar81 = local_3638 - fVar81;
      fVar7 = fVar7 * fVar81;
      auVar102._4_4_ = fVar81;
      auVar102._0_4_ = fVar81;
      auVar102._8_4_ = fVar81;
      auVar102._12_4_ = fVar81;
      auVar32._4_4_ = fVar7;
      auVar32._0_4_ = fVar7;
      auVar32._8_4_ = fVar7;
      auVar32._12_4_ = fVar7;
      local_3738.field_0.x.field_0 = (vfloat_impl<4>)vfmsub231ps_fma(auVar32,auVar98,auVar106);
      auVar42._4_4_ = fVar75;
      auVar42._0_4_ = fVar75;
      auVar42._8_4_ = fVar75;
      auVar42._12_4_ = fVar75;
      local_3738.field_0.y.field_0 = (vfloat_impl<4>)vfmsub231ps_fma(auVar42,auVar102,auVar61);
      auVar47._4_4_ = fVar105;
      auVar47._0_4_ = fVar105;
      auVar47._8_4_ = fVar105;
      auVar47._12_4_ = fVar105;
      auVar59 = vsubps_avx(auVar71,*(undefined1 (*) [16])ray);
      auVar32 = vsubps_avx(auVar77,*(undefined1 (*) [16])(ray + 0x10));
      local_3738.field_0.z.field_0 = (vfloat_impl<4>)vfmsub231ps_fma(auVar47,auVar67,auVar89);
      auVar64 = vsubps_avx(auVar83,*(undefined1 (*) [16])(ray + 0x20));
      auVar38 = *(undefined1 (*) [16])(ray + 0x40);
      auVar39 = *(undefined1 (*) [16])(ray + 0x50);
      auVar103._0_4_ = auVar38._0_4_ * auVar32._0_4_;
      auVar103._4_4_ = auVar38._4_4_ * auVar32._4_4_;
      auVar103._8_4_ = auVar38._8_4_ * auVar32._8_4_;
      auVar103._12_4_ = auVar38._12_4_ * auVar32._12_4_;
      auVar70 = vfmsub231ps_fma(auVar103,auVar59,auVar39);
      auVar58 = *(undefined1 (*) [16])(ray + 0x60);
      auVar84._0_4_ = auVar58._0_4_ * local_3738._32_4_;
      auVar84._4_4_ = auVar58._4_4_ * local_3738._36_4_;
      auVar84._8_4_ = auVar58._8_4_ * local_3738._40_4_;
      auVar84._12_4_ = auVar58._12_4_ * local_3738._44_4_;
      auVar65 = vfmadd231ps_fma(auVar84,(undefined1  [16])local_3738.field_0.y.field_0,auVar39);
      auVar107._0_4_ = auVar39._0_4_ * auVar64._0_4_;
      auVar107._4_4_ = auVar39._4_4_ * auVar64._4_4_;
      auVar107._8_4_ = auVar39._8_4_ * auVar64._8_4_;
      auVar107._12_4_ = auVar39._12_4_ * auVar64._12_4_;
      auVar92 = vfmsub231ps_fma(auVar107,auVar32,auVar58);
      auVar109._0_4_ = auVar58._0_4_ * auVar59._0_4_;
      auVar109._4_4_ = auVar58._4_4_ * auVar59._4_4_;
      auVar109._8_4_ = auVar58._8_4_ * auVar59._8_4_;
      auVar109._12_4_ = auVar58._12_4_ * auVar59._12_4_;
      auVar93 = vfmsub231ps_fma(auVar109,auVar64,auVar38);
      auVar58 = vfmadd231ps_fma(auVar65,(undefined1  [16])local_3738.field_0.x.field_0,auVar38);
      auVar52._0_4_ = fVar81 * auVar70._0_4_;
      auVar52._4_4_ = fVar81 * auVar70._4_4_;
      auVar52._8_4_ = fVar81 * auVar70._8_4_;
      auVar52._12_4_ = fVar81 * auVar70._12_4_;
      auVar38 = vfmadd231ps_fma(auVar52,auVar93,auVar98);
      auVar39 = vfmadd231ps_fma(auVar38,auVar92,auVar67);
      local_3648._8_4_ = 0x80000000;
      local_3648._0_8_ = 0x8000000080000000;
      local_3648._12_4_ = 0x80000000;
      uVar31 = (ulong)*(uint *)(lVar26 + -0x20 + lVar30);
      auVar38 = vandps_avx(auVar58,local_3648);
      uVar96 = auVar38._0_4_;
      auVar94._0_4_ = (float)(uVar96 ^ auVar39._0_4_);
      uVar99 = auVar38._4_4_;
      auVar94._4_4_ = (float)(uVar99 ^ auVar39._4_4_);
      uVar100 = auVar38._8_4_;
      auVar94._8_4_ = (float)(uVar100 ^ auVar39._8_4_);
      uVar101 = auVar38._12_4_;
      auVar94._12_4_ = (float)(uVar101 ^ auVar39._12_4_);
      auVar38 = vcmpps_avx(auVar94,_DAT_01f45a50,5);
      auVar39 = local_3878 & auVar38;
      local_3658 = pfVar3[uVar31];
      fVar75 = pfVar3[uVar31 + 1];
      local_37e8._4_4_ = fVar75;
      local_37e8._0_4_ = fVar75;
      local_37e8._8_4_ = fVar75;
      local_37e8._12_4_ = fVar75;
      fVar75 = pfVar3[uVar31 + 2];
      local_3668._4_4_ = fVar75;
      local_3668._0_4_ = fVar75;
      local_3668._8_4_ = fVar75;
      local_3668._12_4_ = fVar75;
      fStack_3654 = local_3658;
      fStack_3650 = local_3658;
      fStack_364c = local_3658;
      fStack_3634 = local_3638;
      fStack_3630 = local_3638;
      fStack_362c = local_3638;
      fStack_3624 = local_3628;
      fStack_3620 = local_3628;
      fStack_361c = local_3628;
      auVar65 = local_37e8;
      if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar39[0xf] < '\0'
         ) {
        auVar38 = vandps_avx(auVar38,local_3878);
        auVar54._0_4_ = auVar70._0_4_ * fVar8;
        auVar54._4_4_ = auVar70._4_4_ * fVar8;
        auVar54._8_4_ = auVar70._8_4_ * fVar8;
        auVar54._12_4_ = auVar70._12_4_ * fVar8;
        auVar39 = vfmadd213ps_fma(auVar89,auVar93,auVar54);
        auVar39 = vfmadd213ps_fma(auVar61,auVar92,auVar39);
        auVar55._0_4_ = (float)(uVar96 ^ auVar39._0_4_);
        auVar55._4_4_ = (float)(uVar99 ^ auVar39._4_4_);
        auVar55._8_4_ = (float)(uVar100 ^ auVar39._8_4_);
        auVar55._12_4_ = (float)(uVar101 ^ auVar39._12_4_);
        auVar39 = vcmpps_avx(auVar55,_DAT_01f45a50,5);
        auVar70 = auVar38 & auVar39;
        if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar70[0xf] < '\0') {
          auVar70 = vandps_avx(auVar58,local_36a8);
          auVar38 = vandps_avx(auVar39,auVar38);
          auVar39 = vsubps_avx(auVar70,auVar94);
          auVar39 = vcmpps_avx(auVar39,auVar55,5);
          auVar92 = auVar38 & auVar39;
          if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar92[0xf] < '\0') {
            auVar38 = vandps_avx(auVar39,auVar38);
            auVar90._0_4_ = auVar64._0_4_ * local_3738._32_4_;
            auVar90._4_4_ = auVar64._4_4_ * local_3738._36_4_;
            auVar90._8_4_ = auVar64._8_4_ * local_3738._40_4_;
            auVar90._12_4_ = auVar64._12_4_ * local_3738._44_4_;
            auVar39 = vfmadd213ps_fma(auVar32,(undefined1  [16])local_3738.field_0.y.field_0,auVar90
                                     );
            auVar39 = vfmadd213ps_fma(auVar59,(undefined1  [16])local_3738.field_0.x.field_0,auVar39
                                     );
            auVar73._0_4_ = (float)(uVar96 ^ auVar39._0_4_);
            auVar73._4_4_ = (float)(uVar99 ^ auVar39._4_4_);
            auVar73._8_4_ = (float)(uVar100 ^ auVar39._8_4_);
            auVar73._12_4_ = (float)(uVar101 ^ auVar39._12_4_);
            auVar79._0_4_ = auVar70._0_4_ * *(float *)(ray + 0x30);
            auVar79._4_4_ = auVar70._4_4_ * *(float *)(ray + 0x34);
            auVar79._8_4_ = auVar70._8_4_ * *(float *)(ray + 0x38);
            auVar79._12_4_ = auVar70._12_4_ * *(float *)(ray + 0x3c);
            auVar91._0_4_ = auVar70._0_4_ * *(float *)(ray + 0x80);
            auVar91._4_4_ = auVar70._4_4_ * *(float *)(ray + 0x84);
            auVar91._8_4_ = auVar70._8_4_ * *(float *)(ray + 0x88);
            auVar91._12_4_ = auVar70._12_4_ * *(float *)(ray + 0x8c);
            auVar39 = vcmpps_avx(auVar79,auVar73,1);
            auVar59 = vcmpps_avx(auVar73,auVar91,2);
            auVar39 = vandps_avx(auVar59,auVar39);
            auVar59 = auVar38 & auVar39;
            auVar89 = local_37e8;
            if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar59[0xf] < '\0') {
              auVar38 = vandps_avx(auVar38,auVar39);
              auVar39 = vcmpps_avx(auVar58,_DAT_01f45a50,4);
              auVar58 = auVar38 & auVar39;
              if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar58[0xf] < '\0') {
                auVar38 = vandps_avx(auVar39,auVar38);
                local_37f8 = (context->scene->geometries).items[uVar20].ptr;
                uVar96 = local_37f8->mask;
                auVar86._4_4_ = uVar96;
                auVar86._0_4_ = uVar96;
                auVar86._8_4_ = uVar96;
                auVar86._12_4_ = uVar96;
                auVar39 = vpand_avx(auVar86,*(undefined1 (*) [16])(ray + 0x90));
                auVar39 = vpcmpeqd_avx(auVar39,_DAT_01f45a50);
                auVar58 = auVar38 & ~auVar39;
                if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar58[0xf] < '\0') {
                  local_3858 = vandnps_avx(auVar39,auVar38);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (local_37f8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar38 = vrcpps_avx(auVar70);
                    auVar87._8_4_ = 0x3f800000;
                    auVar87._0_8_ = 0x3f8000003f800000;
                    auVar87._12_4_ = 0x3f800000;
                    auVar39 = vfnmadd213ps_fma(auVar70,auVar38,auVar87);
                    auVar38 = vfmadd132ps_fma(auVar39,auVar38,auVar38);
                    fVar75 = auVar38._0_4_;
                    local_3708._0_4_ = fVar75 * auVar73._0_4_;
                    fVar80 = auVar38._4_4_;
                    local_3708._4_4_ = fVar80 * auVar73._4_4_;
                    fVar81 = auVar38._8_4_;
                    fStack_3700 = fVar81 * auVar73._8_4_;
                    fVar105 = auVar38._12_4_;
                    fStack_36fc = fVar105 * auVar73._12_4_;
                    auVar69._0_4_ = fVar75 * auVar94._0_4_;
                    auVar69._4_4_ = fVar80 * auVar94._4_4_;
                    auVar69._8_4_ = fVar81 * auVar94._8_4_;
                    auVar69._12_4_ = fVar105 * auVar94._12_4_;
                    auVar38 = vminps_avx(auVar69,auVar87);
                    auVar57._0_4_ = fVar75 * auVar55._0_4_;
                    auVar57._4_4_ = fVar80 * auVar55._4_4_;
                    auVar57._8_4_ = fVar81 * auVar55._8_4_;
                    auVar57._12_4_ = fVar105 * auVar55._12_4_;
                    auVar39 = vminps_avx(auVar57,auVar87);
                    auVar58 = vsubps_avx(auVar87,auVar38);
                    auVar59 = vsubps_avx(auVar87,auVar39);
                    auVar11._8_8_ = uStack_3680;
                    auVar11._0_8_ = local_3688;
                    local_36e8 = vblendvps_avx(auVar38,auVar58,auVar11);
                    local_36f8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vblendvps_avx(auVar39,auVar59,auVar11);
                    args.valid = (int *)&Ng;
                    args.geometryUserPtr = &t;
                    args.context = (RTCRayQueryContext *)&v;
                    args.ray = (RTCRayN *)&u;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                    ::
                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                         *)&local_3738.field_0);
                    local_36d8._4_4_ = uVar20;
                    local_36d8._0_4_ = uVar20;
                    local_36d8._8_4_ = uVar20;
                    local_36d8._12_4_ = uVar20;
                    local_36f8 = v.field_0;
                    local_36e8._4_4_ = iVar22;
                    local_36e8._0_4_ = iVar22;
                    local_36e8._8_4_ = iVar22;
                    local_36e8._12_4_ = iVar22;
                    vpcmpeqd_avx2(ZEXT1632(local_36d8),ZEXT1632(local_36d8));
                    uStack_36c4 = context->user->instID[0];
                    local_36c8 = uStack_36c4;
                    uStack_36c0 = uStack_36c4;
                    uStack_36bc = uStack_36c4;
                    uStack_36b8 = context->user->instPrimID[0];
                    uStack_36b4 = uStack_36b8;
                    uStack_36b0 = uStack_36b8;
                    uStack_36ac = uStack_36b8;
                    auVar38 = *(undefined1 (*) [16])(ray + 0x80);
                    auVar39 = vblendvps_avx(auVar38,(undefined1  [16])t.field_0,local_3858);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar39;
                    args.valid = (int *)local_3808;
                    args.geometryUserPtr = local_37f8->userPtr;
                    args.context = context->user;
                    args.hit = (RTCHitN *)&local_3738;
                    args.N = 4;
                    args.ray = (RTCRayN *)ray;
                    local_3808 = local_3858;
                    if (local_37f8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*local_37f8->occlusionFilterN)(&args);
                    }
                    if (local_3808 == (undefined1  [16])0x0) {
                      auVar39 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar39 = auVar39 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_37f8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&args);
                      }
                      auVar58 = vpcmpeqd_avx(local_3808,_DAT_01f45a50);
                      auVar39 = auVar58 ^ _DAT_01f46b70;
                      auVar50._8_4_ = 0xff800000;
                      auVar50._0_8_ = 0xff800000ff800000;
                      auVar50._12_4_ = 0xff800000;
                      auVar58 = vblendvps_avx(auVar50,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar58);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar58;
                    }
                    auVar39 = vpslld_avx(auVar39,0x1f);
                    local_3858 = vpsrad_avx(auVar39,0x1f);
                    auVar38 = vblendvps_avx(auVar38,*(undefined1 (*) [16])local_37f0,auVar39);
                    *(undefined1 (*) [16])local_37f0 = auVar38;
                  }
                  local_3878 = vandnps_avx(local_3858,local_3878);
                  auVar89 = local_37e8;
                  auVar65 = local_37e8;
                }
              }
            }
          }
        }
      }
      local_37e8 = auVar89;
      if ((((local_3878 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (local_3878 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (local_3878 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          -1 < local_3878[0xf]) {
        auVar95 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        break;
      }
      auVar12._4_4_ = fStack_3654;
      auVar12._0_4_ = local_3658;
      auVar12._8_4_ = fStack_3650;
      auVar12._12_4_ = fStack_364c;
      auVar9._4_4_ = fVar82;
      auVar9._0_4_ = fVar82;
      auVar9._8_4_ = fVar82;
      auVar9._12_4_ = fVar82;
      auVar59 = vsubps_avx(auVar12,auVar9);
      auVar14._4_4_ = fStack_3624;
      auVar14._0_4_ = local_3628;
      auVar14._8_4_ = fStack_3620;
      auVar14._12_4_ = fStack_361c;
      auVar32 = vsubps_avx(auVar65,auVar14);
      auVar13._4_4_ = fStack_3634;
      auVar13._0_4_ = local_3638;
      auVar13._8_4_ = fStack_3630;
      auVar13._12_4_ = fStack_362c;
      auVar64 = vsubps_avx(local_3668,auVar13);
      auVar70 = vsubps_avx(_local_3888,auVar12);
      auVar92 = vsubps_avx(_local_3818,auVar65);
      auVar93 = vsubps_avx(_local_37d8,local_3668);
      auVar43._0_4_ = auVar32._0_4_ * auVar93._0_4_;
      auVar43._4_4_ = auVar32._4_4_ * auVar93._4_4_;
      auVar43._8_4_ = auVar32._8_4_ * auVar93._8_4_;
      auVar43._12_4_ = auVar32._12_4_ * auVar93._12_4_;
      local_3738.field_0.x.field_0 = (vfloat_impl<4>)vfmsub231ps_fma(auVar43,auVar92,auVar64);
      auVar48._0_4_ = auVar64._0_4_ * auVar70._0_4_;
      auVar48._4_4_ = auVar64._4_4_ * auVar70._4_4_;
      auVar48._8_4_ = auVar64._8_4_ * auVar70._8_4_;
      auVar48._12_4_ = auVar64._12_4_ * auVar70._12_4_;
      local_3738.field_0.y.field_0 = (vfloat_impl<4>)vfmsub231ps_fma(auVar48,auVar93,auVar59);
      auVar78._0_4_ = auVar92._0_4_ * auVar59._0_4_;
      auVar78._4_4_ = auVar92._4_4_ * auVar59._4_4_;
      auVar78._8_4_ = auVar92._8_4_ * auVar59._8_4_;
      auVar78._12_4_ = auVar92._12_4_ * auVar59._12_4_;
      auVar89 = vsubps_avx(auVar12,*(undefined1 (*) [16])ray);
      auVar65 = vsubps_avx(auVar65,*(undefined1 (*) [16])(ray + 0x10));
      auVar42 = vsubps_avx(local_3668,*(undefined1 (*) [16])(ray + 0x20));
      auVar52 = vfmsub231ps_fma(auVar78,auVar70,auVar32);
      auVar38 = *(undefined1 (*) [16])(ray + 0x40);
      auVar39 = *(undefined1 (*) [16])(ray + 0x50);
      auVar104._0_4_ = auVar38._0_4_ * auVar65._0_4_;
      auVar104._4_4_ = auVar38._4_4_ * auVar65._4_4_;
      auVar104._8_4_ = auVar38._8_4_ * auVar65._8_4_;
      auVar104._12_4_ = auVar38._12_4_ * auVar65._12_4_;
      auVar61 = vfmsub231ps_fma(auVar104,auVar89,auVar39);
      auVar58 = *(undefined1 (*) [16])(ray + 0x60);
      auVar85._0_4_ = auVar58._0_4_ * auVar52._0_4_;
      auVar85._4_4_ = auVar58._4_4_ * auVar52._4_4_;
      auVar85._8_4_ = auVar58._8_4_ * auVar52._8_4_;
      auVar85._12_4_ = auVar58._12_4_ * auVar52._12_4_;
      auVar47 = vfmadd231ps_fma(auVar85,(undefined1  [16])local_3738.field_0.y.field_0,auVar39);
      auVar108._0_4_ = auVar39._0_4_ * auVar42._0_4_;
      auVar108._4_4_ = auVar39._4_4_ * auVar42._4_4_;
      auVar108._8_4_ = auVar39._8_4_ * auVar42._8_4_;
      auVar108._12_4_ = auVar39._12_4_ * auVar42._12_4_;
      auVar67 = vfmsub231ps_fma(auVar108,auVar65,auVar58);
      auVar110._0_4_ = auVar58._0_4_ * auVar89._0_4_;
      auVar110._4_4_ = auVar58._4_4_ * auVar89._4_4_;
      auVar110._8_4_ = auVar58._8_4_ * auVar89._8_4_;
      auVar110._12_4_ = auVar58._12_4_ * auVar89._12_4_;
      auVar71 = vfmsub231ps_fma(auVar110,auVar42,auVar38);
      auVar58 = vfmadd231ps_fma(auVar47,(undefined1  [16])local_3738.field_0.x.field_0,auVar38);
      auVar33._0_4_ = auVar93._0_4_ * auVar61._0_4_;
      auVar33._4_4_ = auVar93._4_4_ * auVar61._4_4_;
      auVar33._8_4_ = auVar93._8_4_ * auVar61._8_4_;
      auVar33._12_4_ = auVar93._12_4_ * auVar61._12_4_;
      auVar39 = vfmadd231ps_fma(auVar33,auVar71,auVar92);
      auVar38 = vandps_avx(auVar58,local_3648);
      auVar39 = vfmadd231ps_fma(auVar39,auVar67,auVar70);
      uVar20 = auVar38._0_4_;
      auVar53._0_4_ = (float)(uVar20 ^ auVar39._0_4_);
      uVar96 = auVar38._4_4_;
      auVar53._4_4_ = (float)(uVar96 ^ auVar39._4_4_);
      uVar99 = auVar38._8_4_;
      auVar53._8_4_ = (float)(uVar99 ^ auVar39._8_4_);
      uVar100 = auVar38._12_4_;
      auVar53._12_4_ = (float)(uVar100 ^ auVar39._12_4_);
      auVar38 = vcmpps_avx(auVar53,_DAT_01f45a50,5);
      auVar39 = local_3878 & auVar38;
      if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar39[0xf] < '\0'
         ) {
        auVar38 = vandps_avx(auVar38,local_3878);
        auVar34._0_4_ = auVar64._0_4_ * auVar61._0_4_;
        auVar34._4_4_ = auVar64._4_4_ * auVar61._4_4_;
        auVar34._8_4_ = auVar64._8_4_ * auVar61._8_4_;
        auVar34._12_4_ = auVar64._12_4_ * auVar61._12_4_;
        auVar39 = vfmadd213ps_fma(auVar32,auVar71,auVar34);
        auVar39 = vfmadd213ps_fma(auVar59,auVar67,auVar39);
        auVar62._0_4_ = (float)(uVar20 ^ auVar39._0_4_);
        auVar62._4_4_ = (float)(uVar96 ^ auVar39._4_4_);
        auVar62._8_4_ = (float)(uVar99 ^ auVar39._8_4_);
        auVar62._12_4_ = (float)(uVar100 ^ auVar39._12_4_);
        auVar39 = vcmpps_avx(auVar62,_DAT_01f45a50,5);
        auVar59 = auVar38 & auVar39;
        _local_37d8 = auVar52;
        if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar59[0xf] < '\0') {
          auVar59 = vandps_avx(auVar58,local_36a8);
          auVar38 = vandps_avx(auVar39,auVar38);
          auVar39 = vsubps_avx(auVar59,auVar53);
          auVar39 = vcmpps_avx(auVar39,auVar62,5);
          auVar32 = auVar38 & auVar39;
          if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar32[0xf] < '\0') {
            auVar38 = vandps_avx(auVar39,auVar38);
            auVar35._0_4_ = auVar42._0_4_ * auVar52._0_4_;
            auVar35._4_4_ = auVar42._4_4_ * auVar52._4_4_;
            auVar35._8_4_ = auVar42._8_4_ * auVar52._8_4_;
            auVar35._12_4_ = auVar42._12_4_ * auVar52._12_4_;
            auVar39 = vfmadd213ps_fma(auVar65,(undefined1  [16])local_3738.field_0.y.field_0,auVar35
                                     );
            auVar39 = vfmadd213ps_fma(auVar89,(undefined1  [16])local_3738.field_0.x.field_0,auVar39
                                     );
            auVar68._0_4_ = (float)(uVar20 ^ auVar39._0_4_);
            auVar68._4_4_ = (float)(uVar96 ^ auVar39._4_4_);
            auVar68._8_4_ = (float)(uVar99 ^ auVar39._8_4_);
            auVar68._12_4_ = (float)(uVar100 ^ auVar39._12_4_);
            auVar36._0_4_ = auVar59._0_4_ * *(float *)(ray + 0x30);
            auVar36._4_4_ = auVar59._4_4_ * *(float *)(ray + 0x34);
            auVar36._8_4_ = auVar59._8_4_ * *(float *)(ray + 0x38);
            auVar36._12_4_ = auVar59._12_4_ * *(float *)(ray + 0x3c);
            auVar72._0_4_ = auVar59._0_4_ * *(float *)(ray + 0x80);
            auVar72._4_4_ = auVar59._4_4_ * *(float *)(ray + 0x84);
            auVar72._8_4_ = auVar59._8_4_ * *(float *)(ray + 0x88);
            auVar72._12_4_ = auVar59._12_4_ * *(float *)(ray + 0x8c);
            auVar39 = vcmpps_avx(auVar36,auVar68,1);
            auVar32 = vcmpps_avx(auVar68,auVar72,2);
            auVar39 = vandps_avx(auVar32,auVar39);
            auVar32 = auVar38 & auVar39;
            if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar32[0xf] < '\0') {
              auVar38 = vandps_avx(auVar38,auVar39);
              auVar39 = vcmpps_avx(auVar58,_DAT_01f45a50,4);
              auVar58 = auVar38 & auVar39;
              if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar58[0xf] < '\0') {
                auVar38 = vandps_avx(auVar39,auVar38);
                uVar96 = *(uint *)(lVar26 + lVar30);
                pGVar4 = (context->scene->geometries).items[uVar96].ptr;
                uVar20 = pGVar4->mask;
                auVar37._4_4_ = uVar20;
                auVar37._0_4_ = uVar20;
                auVar37._8_4_ = uVar20;
                auVar37._12_4_ = uVar20;
                auVar39 = vpand_avx(auVar37,*(undefined1 (*) [16])(ray + 0x90));
                auVar39 = vpcmpeqd_avx(auVar39,_DAT_01f45a50);
                auVar58 = auVar38 & ~auVar39;
                if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar58[0xf] < '\0') {
                  uVar21 = *(undefined4 *)(lVar26 + 0x10 + lVar30);
                  _local_3888 = vandnps_avx(auVar39,auVar38);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar38 = vrcpps_avx(auVar59);
                    auVar74._8_4_ = 0x3f800000;
                    auVar74._0_8_ = 0x3f8000003f800000;
                    auVar74._12_4_ = 0x3f800000;
                    auVar39 = vfnmadd213ps_fma(auVar59,auVar38,auVar74);
                    auVar38 = vfmadd132ps_fma(auVar39,auVar38,auVar38);
                    fVar75 = auVar38._0_4_;
                    fVar80 = auVar38._4_4_;
                    fVar81 = auVar38._8_4_;
                    fVar82 = auVar38._12_4_;
                    auVar56._0_4_ = fVar75 * auVar53._0_4_;
                    auVar56._4_4_ = fVar80 * auVar53._4_4_;
                    auVar56._8_4_ = fVar81 * auVar53._8_4_;
                    auVar56._12_4_ = fVar82 * auVar53._12_4_;
                    auVar38 = vminps_avx(auVar56,auVar74);
                    auVar63._0_4_ = fVar75 * auVar62._0_4_;
                    auVar63._4_4_ = fVar80 * auVar62._4_4_;
                    auVar63._8_4_ = fVar81 * auVar62._8_4_;
                    auVar63._12_4_ = fVar82 * auVar62._12_4_;
                    auVar39 = vminps_avx(auVar63,auVar74);
                    auVar58 = vsubps_avx(auVar74,auVar38);
                    auVar59 = vsubps_avx(auVar74,auVar39);
                    auVar10._8_8_ = uStack_3690;
                    auVar10._0_8_ = local_3698;
                    local_36e8 = vblendvps_avx(auVar38,auVar58,auVar10);
                    local_36f8 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                 vblendvps_avx(auVar39,auVar59,auVar10);
                    local_37d8 = auVar52._0_8_;
                    uStack_37d0 = auVar52._8_8_;
                    local_3738._32_8_ = local_37d8;
                    local_3738._40_8_ = uStack_37d0;
                    local_3708._4_4_ = fVar80 * auVar68._4_4_;
                    local_3708._0_4_ = fVar75 * auVar68._0_4_;
                    fStack_3700 = fVar81 * auVar68._8_4_;
                    fStack_36fc = fVar82 * auVar68._12_4_;
                    args.valid = (int *)&Ng;
                    args.geometryUserPtr = &t;
                    args.context = (RTCRayQueryContext *)&v;
                    args.ray = (RTCRayN *)&u;
                    std::
                    _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                    ::
                    _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                              ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                         *)&local_3738.field_0);
                    local_36d8._4_4_ = uVar96;
                    local_36d8._0_4_ = uVar96;
                    local_36d8._8_4_ = uVar96;
                    local_36d8._12_4_ = uVar96;
                    local_36f8 = v.field_0;
                    local_36e8._4_4_ = uVar21;
                    local_36e8._0_4_ = uVar21;
                    local_36e8._8_4_ = uVar21;
                    local_36e8._12_4_ = uVar21;
                    vpcmpeqd_avx2(ZEXT1632(local_36d8),ZEXT1632(local_36d8));
                    uStack_36c4 = context->user->instID[0];
                    local_36c8 = uStack_36c4;
                    uStack_36c0 = uStack_36c4;
                    uStack_36bc = uStack_36c4;
                    uStack_36b8 = context->user->instPrimID[0];
                    uStack_36b4 = uStack_36b8;
                    uStack_36b0 = uStack_36b8;
                    uStack_36ac = uStack_36b8;
                    _local_37d8 = *(undefined1 (*) [16])(ray + 0x80);
                    auVar38 = vblendvps_avx(_local_37d8,(undefined1  [16])t.field_0,_local_3888);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar38;
                    args.valid = (int *)local_3808;
                    args.geometryUserPtr = pGVar4->userPtr;
                    args.context = context->user;
                    args.hit = (RTCHitN *)&local_3738;
                    args.N = 4;
                    args.ray = (RTCRayN *)ray;
                    local_3808 = _local_3888;
                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar4->occlusionFilterN)(&args);
                    }
                    if (local_3808 == (undefined1  [16])0x0) {
                      auVar38 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar38 = auVar38 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&args);
                      }
                      auVar39 = vpcmpeqd_avx(local_3808,_DAT_01f45a50);
                      auVar38 = auVar39 ^ _DAT_01f46b70;
                      auVar49._8_4_ = 0xff800000;
                      auVar49._0_8_ = 0xff800000ff800000;
                      auVar49._12_4_ = 0xff800000;
                      auVar39 = vblendvps_avx(auVar49,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar39);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar39;
                    }
                    auVar38 = vpslld_avx(auVar38,0x1f);
                    _local_3888 = vpsrad_avx(auVar38,0x1f);
                    auVar38 = vblendvps_avx(_local_37d8,*(undefined1 (*) [16])local_37f0,auVar38);
                    *(undefined1 (*) [16])local_37f0 = auVar38;
                  }
                  local_3878 = vandnps_avx(_local_3888,local_3878);
                }
              }
            }
          }
        }
      }
      lVar30 = lVar30 + 4;
      auVar95 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    } while ((((local_3878 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (local_3878 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (local_3878 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             local_3878[0xf] < '\0');
    auVar45 = ZEXT1664(local_37a8);
    auVar39 = vandps_avx(local_3878,local_37a8);
    lVar23 = lVar23 + 1;
    lVar26 = lVar26 + 0x60;
    local_3878 = local_37a8 & local_3878;
    auVar38 = local_37a8;
    local_37a8 = auVar39;
  } while ((((local_3878 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (local_3878 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (local_3878 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           local_3878[0xf] < '\0');
  auVar38 = vpcmpeqd_avx(auVar38,auVar38);
  auVar40._0_4_ = local_37a8._0_4_ ^ auVar38._0_4_;
  auVar40._4_4_ = local_37a8._4_4_ ^ auVar38._4_4_;
  auVar40._8_4_ = local_37a8._8_4_ ^ auVar38._8_4_;
  auVar40._12_4_ = local_37a8._12_4_ ^ auVar38._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar40,(undefined1  [16])terminated.field_0);
  auVar38 = auVar38 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar38 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar38 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar38[0xf])
  goto LAB_0163d366;
  auVar45 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
  auVar51._8_4_ = 0xff800000;
  auVar51._0_8_ = 0xff800000ff800000;
  auVar51._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar51,
                     (undefined1  [16])terminated.field_0);
  goto LAB_0163c362;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }